

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O2

void sv_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *rcvbuf,sockaddr *addr,uint flags)

{
  undefined4 in_register_00000084;
  char *pcVar1;
  undefined8 uStack_10;
  
  if (nread < 1) {
    pcVar1 = "nread > 0";
    uStack_10 = 0x3f;
  }
  else if (nread == 4) {
    if (addr == (sockaddr *)0x0) {
      pcVar1 = "addr != NULL";
      uStack_10 = 0x47;
    }
    else {
      if (*(int *)rcvbuf->base == 0x54495845) {
        uv_close(handle,close_cb,rcvbuf,addr,CONCAT44(in_register_00000084,flags));
        uv_close(&client,close_cb);
        sv_recv_cb_called = sv_recv_cb_called + 1;
        return;
      }
      pcVar1 = "memcmp(\"EXIT\", rcvbuf->base, nread) == 0";
      uStack_10 = 0x49;
    }
  }
  else {
    pcVar1 = "nread == 4";
    uStack_10 = 0x46;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-try-send.c"
          ,uStack_10,pcVar1);
  abort();
}

Assistant:

static void sv_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* rcvbuf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  if (nread > 0) {
    ASSERT(nread == 4);
    ASSERT(addr != NULL);
    ASSERT(memcmp("EXIT", rcvbuf->base, nread) == 0);
    if (++sv_recv_cb_called == 4) {
      uv_close((uv_handle_t*) &server, close_cb);
      uv_close((uv_handle_t*) &client, close_cb);
    }
  }
}